

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O1

bool jbcoin::STObject::equivalentSTObjectSameTemplate(STObject *obj1,STObject *obj2)

{
  pointer pSVar1;
  pointer pSVar2;
  int iVar3;
  int iVar4;
  STBase *pSVar5;
  STBase **ppSVar6;
  STBase *pSVar7;
  pointer pSVar8;
  
  if (obj1->mType == (SOTemplate *)0x0) {
    __assert_fail("obj1.mType != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STObject.cpp"
                  ,0x2fc,
                  "static bool jbcoin::STObject::equivalentSTObjectSameTemplate(const STObject &, const STObject &)"
                 );
  }
  if (obj1->mType != obj2->mType) {
    __assert_fail("obj1.mType == obj2.mType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STObject.cpp"
                  ,0x2fd,
                  "static bool jbcoin::STObject::equivalentSTObjectSameTemplate(const STObject &, const STObject &)"
                 );
  }
  pSVar1 = (obj1->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar2 = (obj1->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pSVar8 = (obj2->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((long)pSVar1 - (long)pSVar2 ==
      (long)pSVar8 -
      (long)(obj2->v_).
            super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
    if (pSVar1 == pSVar2) {
      return pSVar1 == pSVar2;
    }
    pSVar5 = pSVar1->p_;
    pSVar7 = pSVar8->p_;
    iVar3 = (*pSVar5->_vptr_STBase[4])(pSVar5);
    iVar4 = (*pSVar7->_vptr_STBase[4])(pSVar7);
    if (iVar3 == iVar4) {
      ppSVar6 = &pSVar8[1].p_;
      do {
        pSVar8 = pSVar1 + 1;
        iVar3 = (*pSVar5->_vptr_STBase[9])(pSVar5,pSVar7);
        if ((char)iVar3 == '\0') {
          return false;
        }
        if (pSVar8 == pSVar2) {
          return pSVar8 == pSVar2;
        }
        pSVar5 = pSVar1[1].p_;
        pSVar7 = *ppSVar6;
        iVar3 = (*pSVar5->_vptr_STBase[4])(pSVar5);
        iVar4 = (*pSVar7->_vptr_STBase[4])(pSVar7);
        ppSVar6 = ppSVar6 + 0xc;
        pSVar1 = pSVar8;
      } while (iVar3 == iVar4);
    }
  }
  return false;
}

Assistant:

bool STObject::equivalentSTObjectSameTemplate (
    STObject const& obj1, STObject const& obj2)
{
    assert (obj1.mType != nullptr);
    assert (obj1.mType == obj2.mType);

    return std::equal (obj1.begin (), obj1.end (), obj2.begin (), obj2.end (),
        [] (STBase const& st1, STBase const& st2)
        {
            return (st1.getSType() == st2.getSType()) &&
                st1.isEquivalent (st2);
        });
}